

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::backtrack_from_binary_variables
          (Proof *this,vector<int,_std::allocator<int>_> *v)

{
  long *plVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  int *piVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  int *w;
  int *piVar7;
  _Any_data local_78;
  undefined8 uStack_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  uVar3._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       ((_Var2._M_head_impl)->proof_stream)._M_t;
  if ((_Var2._M_head_impl)->doing_hom_colour_proof == false) {
    std::operator<<((ostream *)
                    uVar3._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                    ._M_head_impl,"u");
    piVar4 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar7 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_start;
        uVar3._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t, piVar7 != piVar4; piVar7 = piVar7 + 1) {
      poVar5 = std::operator<<((ostream *)
                               uVar3._M_t.
                               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                               ._M_head_impl," 1 ~x");
      local_78._M_unused._0_8_ = (undefined8)(long)*piVar7;
      pmVar6 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->binary_variable_mappings,(key_type_conflict1 *)local_78._M_pod_data)
      ;
      std::operator<<(poVar5,(string *)pmVar6);
    }
    std::operator<<((ostream *)
                    uVar3._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                    ._M_head_impl," >= 1 ;\n");
    plVar1 = &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line;
    *plVar1 = *plVar1 + 1;
  }
  else {
    poVar5 = std::operator<<((ostream *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl,"* backtrack shenanigans, depth ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,'\n');
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    pcStack_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    uStack_68 = 0;
    uStack_60 = 0;
    local_58._M_unused._M_object = operator_new(0x18);
    local_58._8_8_ = local_78._8_8_;
    *(vector<int,_std::allocator<int>_> **)local_58._M_unused._0_8_ = v;
    *(Proof **)((long)local_58._M_unused._0_8_ + 8) = this;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    *(_Any_data **)((long)local_58._M_unused._0_8_ + 0x10) = &local_58;
    uStack_68 = 0;
    uStack_60 = 0;
    pcStack_48 = std::
                 _Function_handler<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/proof.cc:976:13)>
                 ::_M_manager;
    pcStack_40 = std::
                 _Function_handler<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/proof.cc:976:13)>
                 ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    uStack_68 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    std::
    function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
    ::operator()((function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
                  *)&local_58,0,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_78);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_78
              );
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
  }
  return;
}

Assistant:

auto Proof::backtrack_from_binary_variables(const vector<int> & v) -> void
{
    if (! _imp->doing_hom_colour_proof) {
        *_imp->proof_stream << "u";
        for (auto & w : v)
            *_imp->proof_stream << " 1 ~x" << _imp->binary_variable_mappings[w];
        *_imp->proof_stream << " >= 1 ;\n";
        ++_imp->proof_line;
    }
    else {
        *_imp->proof_stream << "* backtrack shenanigans, depth " << v.size() << '\n';
        function<auto(unsigned, const vector<pair<int, int>> &)->void> f;
        f = [&](unsigned d, const vector<pair<int, int>> & trail) -> void {
            if (d == v.size()) {
                *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{_imp->hom_colour_proof_p.first, _imp->hom_colour_proof_t.first}];
                for (auto & t : trail)
                    *_imp->proof_stream << " 1 ~x" << _imp->variable_mappings[t];
                *_imp->proof_stream << " >= 1 ;\n";
                ++_imp->proof_line;
            }
            else {
                for (auto & p : _imp->p_clique) {
                    vector<pair<int, int>> new_trail{trail};
                    new_trail.emplace_back(pair{p.first, _imp->t_clique_neighbourhood.find(v[d])->second.first});
                    f(d + 1, new_trail);
                }
            }
        };
        f(0, {});
    }
}